

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::Tree::_copy_props_wo_key(Tree *this,size_t dst_,Tree *that_tree,size_t src_)

{
  char *pcVar1;
  size_t sVar2;
  char *pcVar3;
  size_t sVar4;
  size_t sVar5;
  NodeData *pNVar6;
  NodeData *pNVar7;
  
  pNVar6 = _p(this,dst_);
  pNVar7 = _p(that_tree,src_);
  (pNVar6->m_type).type =
       (ulong)((uint)(pNVar6->m_type).type & 0x2542) | (pNVar7->m_type).type & ~_KEYMASK;
  pcVar1 = (pNVar7->m_val).tag.str;
  sVar2 = (pNVar7->m_val).tag.len;
  pcVar3 = (pNVar7->m_val).scalar.str;
  sVar4 = (pNVar7->m_val).scalar.len;
  sVar5 = (pNVar7->m_val).anchor.len;
  (pNVar6->m_val).anchor.str = (pNVar7->m_val).anchor.str;
  (pNVar6->m_val).anchor.len = sVar5;
  (pNVar6->m_val).scalar.str = pcVar3;
  (pNVar6->m_val).scalar.len = sVar4;
  (pNVar6->m_val).tag.str = pcVar1;
  (pNVar6->m_val).tag.len = sVar2;
  return;
}

Assistant:

void _copy_props_wo_key(size_t dst_, Tree const* that_tree, size_t src_)
    {
        auto      & C4_RESTRICT dst = *_p(dst_);
        auto const& C4_RESTRICT src = *that_tree->_p(src_);
        dst.m_type = (src.m_type & ~_KEYMASK) | (dst.m_type & _KEYMASK);
        dst.m_val  = src.m_val;
    }